

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaBasicItemPtr
xmlSchemaGetNamedComponent
          (xmlSchemaPtr schema,xmlSchemaTypeType itemType,xmlChar *name,xmlChar *targetNs)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlSchemaBasicItemPtr pxVar3;
  void *pvVar4;
  xmlSchemaElementPtr pxVar5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  char *name_00;
  
  if (itemType == XML_SCHEMA_TYPE_ELEMENT) {
    pxVar5 = xmlSchemaGetElem(schema,name,targetNs);
    return (xmlSchemaBasicItemPtr)pxVar5;
  }
  if (itemType == XML_SCHEMA_TYPE_GROUP) {
    if (schema != (xmlSchemaPtr)0x0 && name != (xmlChar *)0x0) {
      iVar2 = xmlStrEqual(targetNs,schema->targetNamespace);
      if ((iVar2 != 0) &&
         (pxVar3 = (xmlSchemaBasicItemPtr)xmlHashLookup(schema->groupDecl,name),
         pxVar3 != (xmlSchemaBasicItemPtr)0x0)) {
        return pxVar3;
      }
      iVar2 = xmlHashSize(schema->schemasImports);
      if (1 < iVar2) {
        name_00 = "##";
        if (targetNs != (xmlChar *)0x0) {
          name_00 = (char *)targetNs;
        }
        pvVar4 = xmlHashLookup(schema->schemasImports,(xmlChar *)name_00);
        if (pvVar4 != (void *)0x0) {
          pxVar3 = (xmlSchemaBasicItemPtr)
                   xmlHashLookup(*(xmlHashTablePtr *)(*(long *)((long)pvVar4 + 0x50) + 0x70),name);
          return pxVar3;
        }
      }
    }
  }
  else {
    pp_Var6 = __xmlGenericError();
    p_Var1 = *pp_Var6;
    ppvVar7 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar7,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xmlschemas.c"
              ,0x13ca);
  }
  return (xmlSchemaBasicItemPtr)0x0;
}

Assistant:

static xmlSchemaBasicItemPtr
xmlSchemaGetNamedComponent(xmlSchemaPtr schema,
			   xmlSchemaTypeType itemType,
			   const xmlChar *name,
			   const xmlChar *targetNs)
{
    switch (itemType) {
	case XML_SCHEMA_TYPE_GROUP:
	    return ((xmlSchemaBasicItemPtr) xmlSchemaGetGroup(schema,
		name, targetNs));
	case XML_SCHEMA_TYPE_ELEMENT:
	    return ((xmlSchemaBasicItemPtr) xmlSchemaGetElem(schema,
		name, targetNs));
	default:
	    TODO
	    return (NULL);
    }
}